

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O1

ICOReader * __thiscall ICOReader::iconAt(ICOReader *this,int index)

{
  QIODevice *pQVar1;
  byte bVar2;
  int *piVar3;
  qsizetype qVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  bool bVar10;
  char cVar11;
  quint16_le qVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int in_EDX;
  uint uVar17;
  int iVar18;
  int iVar19;
  Format FVar20;
  undefined4 in_register_00000034;
  ICOReader *this_00;
  QSize QVar21;
  long in_FS_OFFSET;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QLatin1StringView latin1;
  BMP_INFOHDR header;
  QArrayData *local_e0 [3];
  QString local_c8;
  undefined4 local_a8;
  int iStack_a4;
  uint uStack_a0;
  undefined2 uStack_9c;
  ushort uStack_9a;
  undefined4 local_98;
  int iStack_94;
  uint uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  QString local_78;
  ICONDIRENTRY local_58;
  QString local_48;
  long local_30;
  
  this_00 = (ICOReader *)CONCAT44(in_register_00000034,index);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = -0x5555555555555556;
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_48);
  bVar10 = readHeader(this_00);
  uVar17 = 0;
  if (bVar10) {
    uVar17 = (uint)(this_00->iconDir).idCount.val;
  }
  uVar5 = local_a8;
  iVar13 = iStack_a4;
  uVar6 = uStack_a0;
  uVar7 = local_98;
  iVar14 = iStack_94;
  uVar8 = uStack_90;
  uVar9 = uStack_8c;
  if (in_EDX < (int)uVar17) {
    local_58.bWidth = 0xaa;
    local_58.bHeight = 0xaa;
    local_58.bColorCount = 0xaa;
    local_58.bReserved = 0xaa;
    local_58.wPlanes.val = 0xaaaa;
    local_58.wBitCount.val = 0xaaaa;
    local_58.dwBytesInRes.val = 0xaaaaaaaa;
    local_58.dwImageOffset.val = 0xaaaaaaaa;
    bVar10 = readIconEntry(this_00,in_EDX,&local_58);
    uVar5 = local_a8;
    iVar13 = iStack_a4;
    uVar6 = uStack_a0;
    uVar7 = local_98;
    iVar14 = iStack_94;
    uVar8 = uStack_90;
    uVar9 = uStack_8c;
    if (bVar10) {
      cVar11 = (**(code **)(*(long *)this_00->iod + 0x88))(this_00->iod,local_58.dwImageOffset.val);
      uVar5 = local_a8;
      iVar13 = iStack_a4;
      uVar6 = uStack_a0;
      uVar7 = local_98;
      iVar14 = iStack_94;
      uVar8 = uStack_90;
      uVar9 = uStack_8c;
      if ((cVar11 != '\0') &&
         (uVar16 = local_58._8_8_ & 0xffffffff,
         lVar15 = (**(code **)(*(long *)this_00->iod + 0xa0))(), uVar5 = local_a8,
         iVar13 = iStack_a4, uVar6 = uStack_a0, uVar7 = local_98, iVar14 = iStack_94,
         uVar8 = uStack_90, uVar9 = uStack_8c, (long)uVar16 <= lVar15)) {
        QIODevice::read((longlong)&local_a8);
        if (CONCAT44(iStack_94,local_98) == 8) {
          iVar13 = bcmp((void *)CONCAT26(uStack_9a,CONCAT24(uStack_9c,uStack_a0)),
                        iconAt::pngMagicData,8);
          bVar10 = iVar13 == 0;
        }
        else {
          bVar10 = false;
        }
        piVar3 = (int *)CONCAT44(iStack_a4,local_a8);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(iStack_a4,local_a8),1,0x10);
          }
        }
        if (bVar10) {
          (**(code **)(*(long *)this_00->iod + 0x88))(this_00->iod,local_58.dwImageOffset.val);
          (this->icoAttrib).nbits = -0x55555556;
          (this->icoAttrib).ncolors = -0x55555556;
          (this->icoAttrib).h = -0x55555556;
          (this->icoAttrib).w = -0x55555556;
          *(undefined8 *)&(this->icoAttrib).depth = 0xaaaaaaaaaaaaaaaa;
          QIODevice::read((longlong)&local_a8);
          QVar22.m_data._4_4_ = iStack_94;
          QVar22.m_data._0_4_ = local_98;
          QVar22.m_size = (qsizetype)this;
          QImage::fromData(QVar22,(char *)CONCAT26(uStack_9a,CONCAT24(uStack_9c,uStack_a0)));
          piVar3 = (int *)CONCAT44(iStack_a4,local_a8);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(iStack_a4,local_a8),1,0x10);
            }
          }
          QVar23.m_data = (storage_type *)0xf;
          QVar23.m_size = (qsizetype)&local_a8;
          QString::fromLatin1(QVar23);
          local_78.d.d = (Data *)CONCAT44(iStack_a4,local_a8);
          local_78.d.ptr = (char16_t *)CONCAT26(uStack_9a,CONCAT24(uStack_9c,uStack_a0));
          local_78.d.size = CONCAT44(iStack_94,local_98);
          QString::number((int)&local_a8,(uint)local_58.wBitCount.val);
          QImage::setText((QString *)this,&local_78);
          piVar3 = (int *)CONCAT44(iStack_a4,local_a8);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(iStack_a4,local_a8),2,0x10);
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_00104a47;
        }
        local_88 = 0xaaaaaaaaaaaaaaaa;
        local_98 = 0xaaaaaaaa;
        iStack_94 = -0x55555556;
        uStack_90 = 0xaaaaaaaa;
        uStack_8c = 0xaaaaaaaa;
        local_a8 = 0xaaaaaaaa;
        iStack_a4 = -0x55555556;
        uStack_a0 = 0xaaaaaaaa;
        uStack_9c = 0xaaaa;
        uStack_9a = 0xaaaa;
        pQVar1 = this_00->iod;
        uVar5 = 0xaaaaaaaa;
        iVar13 = -0x55555556;
        uVar6 = 0xaaaaaaaa;
        uVar7 = 0xaaaaaaaa;
        iVar14 = -0x55555556;
        uVar8 = 0xaaaaaaaa;
        uVar9 = 0xaaaaaaaa;
        if ((((pQVar1 != (QIODevice *)0x0) &&
             (cVar11 = (**(code **)(*(long *)pQVar1 + 0x88))
                                 (pQVar1,(ulong)local_58.dwImageOffset.val + this_00->startpos),
             uVar5 = local_a8, iVar13 = iStack_a4, uVar6 = uStack_a0, uVar7 = local_98,
             iVar14 = iStack_94, uVar8 = uStack_90, uVar9 = uStack_8c, cVar11 != '\0')) &&
            (this_00->iod != (QIODevice *)0x0)) &&
           (lVar15 = QIODevice::read((char *)this_00->iod,(longlong)&local_a8), uVar5 = local_a8,
           iVar13 = iStack_a4, uVar6 = uStack_a0, uVar7 = local_98, iVar14 = iStack_94,
           uVar8 = uStack_90, uVar9 = uStack_8c, lVar15 == 0x28)) {
          qVar12.val = uStack_9a;
          if (uStack_9a == 0) {
            qVar12.val = local_58.wBitCount.val;
          }
          uVar16 = (ulong)qVar12.val;
          (this_00->icoAttrib).nbits = (uint)qVar12.val;
          if (qVar12.val < 0x21) {
            if ((0x101010000U >> (uVar16 & 0x3f) & 1) == 0) {
              if ((0x110UL >> (uVar16 & 0x3f) & 1) != 0) {
                iVar19 = 8;
                bVar10 = false;
                goto LAB_00104cbc;
              }
              if (uVar16 != 1) goto LAB_00104a19;
              iVar19 = 1;
              bVar2 = 1;
              bVar10 = false;
            }
            else {
              iVar19 = 0x20;
              bVar10 = true;
LAB_00104cbc:
              bVar2 = 0;
            }
            (this_00->icoAttrib).depth = iVar19;
            iVar19 = 1 << ((byte)qVar12.val & 0x1f);
            if ((int)local_88 != 0) {
              iVar19 = (int)local_88;
            }
            iVar18 = 0;
            if (!bVar10) {
              iVar18 = iVar19;
            }
            (this_00->icoAttrib).ncolors = iVar18;
            if (iVar18 < 0x101) {
              (this_00->icoAttrib).w = (uint)local_58.bWidth;
              if (local_58.bWidth == 0) {
                (this_00->icoAttrib).w = iStack_a4;
              }
              (this_00->icoAttrib).h = (uint)local_58.bHeight;
              if (local_58.bHeight == 0) {
                (this_00->icoAttrib).h = uStack_a0 >> 1;
              }
              if (((this_00->icoAttrib).w < 0x101) && ((this_00->icoAttrib).h < 0x101)) {
                FVar20 = Format_RGB32;
                if ((qVar12.val != 0x18) && (FVar20 = Format_Mono, !(bool)(bVar2 & iVar18 == 2))) {
                  FVar20 = (uint)(iVar18 < 1) * 2 + Format_Indexed8;
                }
                local_78.d.size = -0x5555555555555556;
                local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_78.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                QImage::QImage((QImage *)&local_78);
                QVar21.ht.m_i = (this_00->icoAttrib).h;
                QVar21.wd.m_i = (this_00->icoAttrib).w;
                cVar11 = QImageIOHandler::allocateImage(QVar21,FVar20,(QImage *)&local_78);
                if (cVar11 != '\0') {
                  findColorInfo(this_00,(QImage *)&local_78);
                  cVar11 = QImage::isNull();
                  if (cVar11 == '\0') {
                    readBMP(this_00,(QImage *)&local_78);
                    cVar11 = QImage::isNull();
                    if (cVar11 == '\0') {
                      if ((this_00->icoAttrib).nbits == 0x20) {
                        QImage::convertToFormat
                                  ((QImage *)&local_c8,(Format)&local_78,(ImageConversionFlags)0x6);
                        QImage::operator=((QImage *)&local_48,(QImage *)&local_c8);
                      }
                      else {
                        local_c8.d.size = -0x5555555555555556;
                        local_c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                        local_c8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                        iVar13 = QImage::width();
                        iVar14 = QImage::height();
                        QImage::QImage((QImage *)&local_c8,iVar13,iVar14,Format_Mono);
                        cVar11 = QImage::isNull();
                        if (cVar11 == '\0') {
                          iVar13 = (int)(QImage *)&local_c8;
                          QImage::setColorCount(iVar13);
                          QImage::setColor(iVar13,0);
                          QImage::setColor(iVar13,1);
                          read1BitBMP(this_00,(QImage *)&local_c8);
                          cVar11 = QImage::isNull();
                          if (cVar11 == '\0') {
                            QImage::operator=((QImage *)&local_48,(QImage *)&local_78);
                            QImage::setAlphaChannel((QImage *)&local_48);
                          }
                        }
                      }
                      QImage::~QImage((QImage *)&local_c8);
                    }
                  }
                }
                latin1.m_data = "_q_icoOrigDepth";
                latin1.m_size = 0xf;
                QString::QString(&local_c8,latin1);
                QString::number((int)local_e0,(uint)local_58.wBitCount.val);
                QImage::setText(&local_48,&local_c8);
                if (local_e0[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_e0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_e0[0],2,0x10);
                  }
                }
                if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                QImage::~QImage((QImage *)&local_78);
                uVar5 = local_a8;
                iVar13 = iStack_a4;
                uVar6 = uStack_a0;
                uVar7 = local_98;
                iVar14 = iStack_94;
                uVar8 = uStack_90;
                uVar9 = uStack_8c;
              }
            }
          }
        }
      }
    }
  }
LAB_00104a19:
  uStack_8c = uVar9;
  uStack_90 = uVar8;
  iStack_94 = iVar14;
  local_98 = uVar7;
  uStack_a0 = uVar6;
  iStack_a4 = iVar13;
  local_a8 = uVar5;
  QPaintDevice::QPaintDevice((QPaintDevice *)this);
  qVar4 = local_48.d.size;
  *(undefined8 **)&this->icoAttrib = &QImageIOPlugin::staticMetaObject;
  local_48.d.size = 0;
  *(qsizetype *)&(this->icoAttrib).depth = qVar4;
LAB_00104a47:
  QImage::~QImage((QImage *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QImage ICOReader::iconAt(int index)
{
    QImage img;

    if (count() > index) { // forces header to be read

        ICONDIRENTRY iconEntry;
        if (readIconEntry(index, &iconEntry)) {

            static const uchar pngMagicData[] = { 137, 80, 78, 71, 13, 10, 26, 10 };

            if (!iod->seek(iconEntry.dwImageOffset)
                || iconEntry.dwBytesInRes > iod->bytesAvailable())
                return img;

            const QByteArray pngMagic = QByteArray::fromRawData((const char*)pngMagicData, sizeof(pngMagicData));
            const bool isPngImage = (iod->read(pngMagic.size()) == pngMagic);

            if (isPngImage) {
                iod->seek(iconEntry.dwImageOffset);
                QImage image = QImage::fromData(iod->read(iconEntry.dwBytesInRes), "png");
                image.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
                return image;
            }

            BMP_INFOHDR header;
            if (readBMPHeader(iconEntry.dwImageOffset, &header)) {
                icoAttrib.nbits = header.biBitCount ? header.biBitCount : iconEntry.wBitCount;

                switch (icoAttrib.nbits) {
                case 32:
                case 24:
                case 16:
                    icoAttrib.depth = 32;
                    break;
                case 8:
                case 4:
                    icoAttrib.depth = 8;
                    break;
                case 1:
                    icoAttrib.depth = 1;
                    break;
                default:
                    return img;
                    break;
                }
                if (icoAttrib.depth == 32)                // there's no colormap
                    icoAttrib.ncolors = 0;
                else                    // # colors used
                    icoAttrib.ncolors = header.biClrUsed ? uint(header.biClrUsed) : 1 << icoAttrib.nbits;
                if (icoAttrib.ncolors > 256) //color table can't be more than 256
                    return img;
                icoAttrib.w = iconEntry.bWidth;
                if (icoAttrib.w == 0) // means 256 pixels
                    icoAttrib.w = header.biWidth;
                icoAttrib.h = iconEntry.bHeight;
                if (icoAttrib.h == 0) // means 256 pixels
                    icoAttrib.h = header.biHeight/2;
                if (icoAttrib.w > 256 || icoAttrib.h > 256) // Max ico size
                    return img;

                QImage::Format format = QImage::Format_ARGB32;
                if (icoAttrib.nbits == 24)
                    format = QImage::Format_RGB32;
                else if (icoAttrib.ncolors == 2 && icoAttrib.depth == 1)
                    format = QImage::Format_Mono;
                else if (icoAttrib.ncolors > 0)
                    format = QImage::Format_Indexed8;

                QImage image;
                const QSize size(icoAttrib.w, icoAttrib.h);
                if (QImageIOHandler::allocateImage(size, format, &image)) {
                    findColorInfo(image);
                    if (!image.isNull()) {
                        readBMP(image);
                        if (!image.isNull()) {
                            if (icoAttrib.nbits == 32) {
                                img = std::move(image).convertToFormat(QImage::Format_ARGB32_Premultiplied);
                            } else {
                                QImage mask(image.width(), image.height(), QImage::Format_Mono);
                                if (!mask.isNull()) {
                                    mask.setColorCount(2);
                                    mask.setColor(0, qRgba(255,255,255,0xff));
                                    mask.setColor(1, qRgba(0  ,0  ,0  ,0xff));
                                    read1BitBMP(mask);
                                    if (!mask.isNull()) {
                                        img = image;
                                        img.setAlphaChannel(mask);
                                    }
                                }
                            }
                        }
                    }
                }
                img.setText(QLatin1String(icoOrigDepthKey), QString::number(iconEntry.wBitCount));
            }
        }
    }

    return img;
}